

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accel.h
# Opt level: O2

int __thiscall
embree::Accel::Intersectors::select
          (Intersectors *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  char *pcVar1;
  OccludedFunc4 p_Var2;
  OccludedFunc8 p_Var3;
  OccludedFunc16 p_Var4;
  Intersector16 *in_RAX;
  char cVar5;
  
  cVar5 = (char)__nfds;
  if ((this->intersector4_filter).name == (char *)0x0) {
    if ((this->intersector8_filter).name == (char *)0x0) goto LAB_00176b43;
    in_RAX = (Intersector16 *)&DAT_000000a0;
    if (cVar5 == '\0') goto LAB_00176b27;
  }
  else if (cVar5 == '\0') {
    in_RAX = (Intersector16 *)(this->intersector4_nofilter).name;
    (this->intersector4).name = (char *)in_RAX;
    p_Var2 = (this->intersector4_nofilter).occluded;
    (this->intersector4).intersect = (this->intersector4_nofilter).intersect;
    (this->intersector4).occluded = p_Var2;
    if ((this->intersector8_filter).name == (char *)0x0) goto LAB_00176b43;
LAB_00176b27:
    in_RAX = (Intersector16 *)0xb8;
  }
  else {
    (this->intersector4).name = (this->intersector4_filter).name;
    p_Var2 = (this->intersector4_filter).occluded;
    (this->intersector4).intersect = (this->intersector4_filter).intersect;
    (this->intersector4).occluded = p_Var2;
    in_RAX = (Intersector16 *)&DAT_000000a0;
    if ((this->intersector8_filter).name == (char *)0x0) goto LAB_00176b43;
  }
  (this->intersector8).name = *(char **)((long)&in_RAX->intersect + (long)&(this->collider).collide)
  ;
  pcVar1 = (char *)((long)&in_RAX->intersect + (long)&this->ptr);
  p_Var3 = *(OccludedFunc8 *)(pcVar1 + 8);
  (this->intersector8).intersect = *(IntersectFunc8 *)pcVar1;
  (this->intersector8).occluded = p_Var3;
LAB_00176b43:
  if ((this->intersector16_filter).name != (char *)0x0) {
    in_RAX = &this->intersector16_nofilter;
    if (cVar5 != '\0') {
      in_RAX = &this->intersector16_filter;
    }
    (this->intersector16).name = in_RAX->name;
    p_Var4 = in_RAX->occluded;
    (this->intersector16).intersect = in_RAX->intersect;
    (this->intersector16).occluded = p_Var4;
  }
  return (int)in_RAX;
}

Assistant:

operator bool() const { return name; }